

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O2

UChar * __thiscall icu_63::LocDataParser::nextString(LocDataParser *this)

{
  UChar UVar1;
  UChar UVar2;
  UBool UVar3;
  UChar *pUVar4;
  UChar *pUVar5;
  char *in_RSI;
  undefined1 *list;
  UChar *pUVar6;
  
  skipWhitespace(this);
  pUVar4 = this->e;
  pUVar5 = this->p;
  if (pUVar5 < pUVar4) {
    UVar1 = *pUVar5;
    if ((UVar1 == L'\'') || (UVar1 == L'\"')) {
      this->ch = L'\xffff';
      pUVar5 = pUVar5 + 1;
      this->p = pUVar5;
      list = (undefined1 *)0x30a134;
      pUVar6 = pUVar5;
      if (UVar1 == L'\"') {
        list = (undefined1 *)0x30a130;
      }
    }
    else {
      list = NOQUOTE_STOPLIST;
      pUVar6 = pUVar5;
    }
    while (pUVar5 < pUVar4) {
      in_RSI = (char *)(ulong)(ushort)*pUVar5;
      UVar3 = inList(this,*pUVar5,(UChar *)list);
      pUVar4 = this->e;
      pUVar5 = this->p;
      if (UVar3 != '\0') break;
      pUVar5 = pUVar5 + 1;
      this->p = pUVar5;
    }
    if (pUVar5 != pUVar4) {
      UVar2 = *pUVar5;
      if (pUVar6 < pUVar5) {
        this->ch = UVar2;
        *pUVar5 = L'\0';
        pUVar4 = pUVar6;
      }
      else {
        pUVar4 = (UChar *)0x0;
      }
      if ((UVar1 == L'\'') || (UVar1 == L'\"')) {
        if ((UVar2 == UVar1) && (pUVar5 != pUVar6)) {
          this->p = pUVar5 + 1;
          this->ch = L'\xffff';
          return pUVar4;
        }
      }
      else {
        if (0x3c < (ushort)UVar2) {
          return pUVar4;
        }
        if ((0x1000008400000000U >> ((ulong)(uint)(ushort)UVar2 & 0x3f) & 1) == 0) {
          return pUVar4;
        }
      }
    }
    parseError(this,in_RSI);
  }
  return (UChar *)0x0;
}

Assistant:

UChar*
LocDataParser::nextString() {
    UChar* result = NULL;
    
    skipWhitespace();
    if (p < e) {
        const UChar* terminators;
        UChar c = *p;
        UBool haveQuote = c == QUOTE || c == TICK;
        if (haveQuote) {
            inc();
            terminators = c == QUOTE ? DQUOTE_STOPLIST : SQUOTE_STOPLIST;
        } else {
            terminators = NOQUOTE_STOPLIST;
        }
        UChar* start = p;
        while (p < e && !inList(*p, terminators)) ++p;
        if (p == e) {
            ERROR("Unexpected end of data");
        }
        
        UChar x = *p;
        if (p > start) {
            ch = x;
            *p = 0x0; // terminate by writing to data
            result = start; // just point into data
        }
        if (haveQuote) {
            if (x != c) {
                ERROR("Missing matching quote");
            } else if (p == start) {
                ERROR("Empty string");
            }
            inc();
        } else if (x == OPEN_ANGLE || x == TICK || x == QUOTE) {
            ERROR("Unexpected character in string");
        }
    }

    // ok for there to be no next string
    return result;
}